

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O1

enable_if_t<std::is_base_of_v<Serializable,_Bar>,_void> __thiscall
miyuki::serialize::InputArchive::_load<Bar>(InputArchive *this,shared_ptr<Bar> *ptr)

{
  pointer *pprVar1;
  pointer *ppiVar2;
  uint uVar3;
  pointer prVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar5;
  element_type *peVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  int iVar10;
  Bar *__tmp;
  const_reference pvVar11;
  undefined4 extraout_var;
  const_iterator cVar13;
  uint *puVar14;
  _Hash_node_base *p_Var15;
  int *piVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  mapped_type *pmVar18;
  element_type *peVar19;
  long lVar20;
  undefined8 uVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  ulong uVar23;
  _Hash_node_base *p_Var24;
  shared_ptr<Bar> *__endptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  __node_base_ptr p_Var26;
  __node_base_ptr p_Var27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_s;
  key_type local_a8;
  InputArchive *local_80;
  key_type local_78;
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long *plVar12;
  
  prVar4 = (this->stack).
           super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __endptr = ptr;
  if ((prVar4[-1]._M_data)->m_type == null) goto LAB_001158cb;
  pbVar5 = prVar4[-1]._M_data;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"type","");
  pvVar11 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(pbVar5,&local_a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_58 + 8),
             pvVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  iVar10 = (**this->context->_vptr_Context)(this->context,local_58 + 8);
  plVar12 = (long *)CONCAT44(extraout_var,iVar10);
  pbVar5 = (this->stack).
           super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  if ((pbVar5->m_type != object) ||
     (cVar13 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               ::_M_find_tr<char[6],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                           *)(pbVar5->m_value).object,(char (*) [6])"props"),
     (_Rb_tree_header *)cVar13._M_node ==
     &(((pbVar5->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
LAB_00115831:
    pbVar5 = (this->stack).
             super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"addr","");
    local_80 = this;
    pvVar11 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::at(pbVar5,&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_a8,pvVar11);
    _Var8._M_p = local_a8._M_dataplus._M_p;
    piVar16 = __errno_location();
    iVar10 = *piVar16;
    *piVar16 = 0;
    __endptr = (shared_ptr<Bar> *)local_58;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)strtol(_Var8._M_p,(char **)__endptr,10);
    if ((pointer)local_58._0_8_ == _Var8._M_p) {
      std::__throw_invalid_argument("stol");
LAB_00115c68:
      uVar21 = std::__throw_invalid_argument("stol");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._8_8_ != &local_40) {
        operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar21);
    }
    if (*piVar16 == 0) {
      *piVar16 = iVar10;
    }
    else if (*piVar16 == 0x22) {
      std::__throw_out_of_range("stol");
LAB_001158cb:
      p_Var22 = (__endptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (__endptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
      (__endptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var22 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
      return;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar17;
    pmVar18 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&local_80->ptrs,(key_type *)&local_a8);
    peVar6 = (pmVar18->
             super___shared_ptr<miyuki::serialize::Serializable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (peVar6 == (element_type *)0x0) {
      peVar19 = (element_type *)0x0;
    }
    else {
      peVar19 = (element_type *)__dynamic_cast(peVar6,&Serializable::typeinfo,&Bar::typeinfo);
    }
    if (peVar19 == (element_type *)0x0) {
      peVar19 = (element_type *)0x0;
      p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var22 = (pmVar18->
                super___shared_ptr<miyuki::serialize::Serializable,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
        }
      }
    }
    (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar19;
    p_Var25 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var22;
    if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
    }
    goto LAB_00115c32;
  }
  pbVar5 = (this->stack).
           super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  if ((pbVar5->m_type == object) &&
     (cVar13 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
               ::_M_find_tr<char[5],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                           *)(pbVar5->m_value).object,(char (*) [5])"addr"),
     (_Rb_tree_header *)cVar13._M_node !=
     &(((pbVar5->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pbVar5 = (this->stack).
             super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"addr","");
    local_80 = this;
    pvVar11 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::at(pbVar5,&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_a8,pvVar11);
    _Var8._M_p = local_a8._M_dataplus._M_p;
    puVar14 = (uint *)__errno_location();
    uVar3 = *puVar14;
    this = (InputArchive *)(ulong)uVar3;
    *puVar14 = 0;
    p_Var15 = (_Hash_node_base *)strtol(_Var8._M_p,(char **)local_58,10);
    if ((pointer)local_58._0_8_ == _Var8._M_p) goto LAB_00115c68;
    if (*puVar14 == 0) {
      *puVar14 = uVar3;
    }
    else if (*puVar14 == 0x22) {
      std::__throw_out_of_range("stol");
      goto LAB_00115831;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    this = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    uVar7 = (this->ptrs)._M_h._M_bucket_count;
    uVar23 = (ulong)p_Var15 % uVar7;
    p_Var26 = (this->ptrs)._M_h._M_buckets[uVar23];
    p_Var27 = (__node_base_ptr)0x0;
    if ((p_Var26 != (__node_base_ptr)0x0) &&
       (p_Var24 = p_Var26->_M_nxt, p_Var27 = p_Var26, p_Var15 != p_Var26->_M_nxt[1]._M_nxt)) {
      while (p_Var26 = p_Var24, p_Var24 = p_Var26->_M_nxt, p_Var24 != (_Hash_node_base *)0x0) {
        p_Var27 = (__node_base_ptr)0x0;
        if (((ulong)p_Var24[1]._M_nxt % uVar7 != uVar23) ||
           (p_Var27 = p_Var26, p_Var15 == p_Var24[1]._M_nxt)) goto LAB_00115ab1;
      }
      p_Var27 = (__node_base_ptr)0x0;
    }
LAB_00115ab1:
    if (p_Var27 == (__node_base_ptr)0x0) {
      p_Var24 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var24 = p_Var27->_M_nxt;
    }
    if (p_Var24 != (_Hash_node_base *)0x0) {
      if (p_Var24[2]._M_nxt == (_Hash_node_base *)0x0) {
        peVar19 = (element_type *)0x0;
      }
      else {
        peVar19 = (element_type *)
                  __dynamic_cast(p_Var24[2]._M_nxt,&Serializable::typeinfo,&Bar::typeinfo);
      }
      if (peVar19 == (element_type *)0x0) {
        peVar19 = (element_type *)0x0;
        p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var24[3]._M_nxt;
        if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
          }
        }
      }
      (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar19;
      p_Var25 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var22;
      goto LAB_00115bb4;
    }
    lVar20 = (**(code **)(*plVar12 + 8))(plVar12);
    if (lVar20 == 0) {
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      local_a8._M_dataplus._M_p =
           (pointer)__dynamic_cast(lVar20,&Serializable::typeinfo,&Bar::typeinfo,0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Bar*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length,
               (Bar *)local_a8._M_dataplus._M_p);
    sVar9 = local_a8._M_string_length;
    _Var8._M_p = local_a8._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    p_Var22 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)_Var8._M_p;
    (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar9;
    if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
    }
    local_a8._M_dataplus._M_p = (pointer)p_Var15;
    pmVar18 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ptrs,(key_type *)&local_a8);
    (pmVar18->super___shared_ptr<miyuki::serialize::Serializable,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = &((ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Serializable;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar18->
                super___shared_ptr<miyuki::serialize::Serializable,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,&(ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
    ;
    this = local_80;
  }
  else {
    lVar20 = (**(code **)(*plVar12 + 8))(plVar12);
    if (lVar20 == 0) {
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      local_a8._M_dataplus._M_p =
           (pointer)__dynamic_cast(lVar20,&Serializable::typeinfo,&Bar::typeinfo,0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Bar*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length,
               (Bar *)local_a8._M_dataplus._M_p);
    sVar9 = local_a8._M_string_length;
    _Var8._M_p = local_a8._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    p_Var22 = (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)_Var8._M_p;
    (ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar9;
    p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length;
    if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
      p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length;
    }
LAB_00115bb4:
    if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
    }
  }
  pbVar5 = (this->stack).
           super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"props","");
  pvVar11 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(pbVar5,&local_a8);
  _makeNode(this,pvVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*plVar12 + 0x18))
            (plVar12,(ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,this);
  pprVar1 = &(this->stack).
             super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pprVar1 = *pprVar1 + -1;
  ppiVar2 = &(this->counter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar2 = *ppiVar2 + -1;
LAB_00115c32:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._8_8_ != &local_40) {
    operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

std::enable_if_t<std::is_base_of_v<Serializable, T>, void>
        _load(std::shared_ptr<T> &ptr) {
            if (_top().is_null()) {
                ptr = nullptr;
                return;
            }
            auto type_s = _top().at("type").get<std::string>();
            auto type = context.getType(type_s);
            if (_top().contains("props")) {
                if (_top().contains("addr")) {
                    auto addr = std::stol(_top().at("addr").get<std::string>());
                    auto it = ptrs.find(addr);
                    if (it == ptrs.end()) {
                        ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                        ptrs[addr] = ptr;
                    } else {
                        ptr = std::dynamic_pointer_cast<T>(it->second);
                    }
                } else {
                    ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                }
                _makeNode(_top().at("props"));
                type->load(*ptr, *this);
                _popNode();
            } else {
                auto addr = std::stol(_top().at("addr").get<std::string>());
                ptr = std::dynamic_pointer_cast<T>(ptrs.at(addr));
            }
        }